

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGhsMultiGenerator::TrimQuotes
          (string *__return_storage_ptr__,cmGlobalGhsMultiGenerator *this,string *str)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = (str->_M_dataplus)._M_p;
  do {
    if (*pcVar1 != '\"') {
      if (*pcVar1 == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

std::string cmGlobalGhsMultiGenerator::TrimQuotes(std::string const& str)
{
  std::string result;
  result.reserve(str.size());
  for (const char* ch = str.c_str(); *ch != '\0'; ++ch) {
    if (*ch != '"') {
      result += *ch;
    }
  }
  return result;
}